

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void learn(svm_params *params,single_learner *param_2,example *ec)

{
  svm_model *psVar1;
  svm_example *this;
  float *pfVar2;
  byte bVar3;
  flat_example *__src;
  svm_example *psVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  vw *pvVar9;
  size_t sVar10;
  vw_ostream *pvVar11;
  float fVar12;
  float score;
  svm_example *sec;
  float local_3c;
  svm_example *local_38;
  
  __src = flatten_sort_example(params->all,ec);
  if (__src != (flat_example *)0x0) {
    psVar4 = calloc_or_throw<svm_example>(1);
    local_38 = psVar4;
    memcpy(&psVar4->ex,__src,200);
    free(__src);
    local_3c = 0.0;
    predict(params,&local_38,&local_3c,1);
    (ec->pred).scalar = local_3c;
    fVar12 = 1.0 - local_3c * (ec->l).simple.label;
    if (fVar12 <= 0.0) {
      fVar12 = 0.0;
    }
    ec->loss = fVar12;
    params->loss_sum = fVar12 + params->loss_sum;
    pvVar9 = params->all;
    bVar3 = pvVar9->training;
    if (((bool)bVar3 == true) &&
       (uVar7 = ec->example_counter * -0x70a3d70a3d70a3d7,
       (uVar7 >> 2 | uVar7 << 0x3e) < 0x28f5c28f5c28f5d)) {
      psVar1 = params->model;
      sVar6 = psVar1->num_support;
      if (sVar6 != 0) {
        iVar8 = (int)params->maxcache;
        sVar10 = 0;
        do {
          this = (psVar1->support_vec)._begin[sVar10];
          pfVar2 = (this->krow)._begin;
          iVar8 = iVar8 - (int)((ulong)((long)(this->krow)._end - (long)pfVar2) >> 2);
          if (iVar8 < 0) {
            (this->krow)._end = pfVar2;
            v_array<float>::resize(&this->krow,0);
          }
          sVar10 = sVar10 + 1;
        } while (sVar6 != sVar10);
        pvVar9 = params->all;
        bVar3 = pvVar9->training;
      }
    }
    if ((bVar3 & 1) != 0) {
      uVar7 = ec->example_counter;
      if ((1 < uVar7) && (uVar7 == (uVar7 / 1000) * 1000)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(pvVar9->trace_message).super_ostream,"Number of support vectors = ",0x1c);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar9->trace_message);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pvVar11 = &params->all->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar11->super_ostream,"Number of kernel evaluations = ",0x1f);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)pvVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Number of cache queries = ",0x1a)
        ;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," loss sum = ",0xc);
        poVar5 = std::ostream::_M_insert<double>((double)params->loss_sum);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(params->model->alpha)._begin[params->model->num_support - 1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(params->model->alpha)._begin[params->model->num_support - 2]);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
    }
    params->pool[params->pool_pos] = psVar4;
    sVar6 = params->pool_pos + 1;
    params->pool_pos = sVar6;
    if (sVar6 == params->pool_size) {
      train(params);
      params->pool_pos = 0;
    }
  }
  return;
}

Assistant:

void learn(svm_params& params, single_learner&, example& ec)
{
  flat_example* fec = flatten_sort_example(*(params.all), &ec);
  if (fec)
  {
    svm_example* sec = &calloc_or_throw<svm_example>();
    sec->init_svm_example(fec);
    float score = 0;
    predict(params, &sec, &score, 1);
    ec.pred.scalar = score;
    // cout<<"Score = "<<score<<endl;
    ec.loss = max(0.f, 1.f - score * ec.l.simple.label);
    params.loss_sum += ec.loss;
    if (params.all->training && ec.example_counter % 100 == 0)
      trim_cache(params);
    if (params.all->training && ec.example_counter % 1000 == 0 && ec.example_counter >= 2)
    {
      params.all->trace_message << "Number of support vectors = " << params.model->num_support << endl;
      params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                                << "Number of cache queries = " << num_cache_evals << " loss sum = " << params.loss_sum
                                << " " << params.model->alpha[params.model->num_support - 1] << " "
                                << params.model->alpha[params.model->num_support - 2] << endl;
    }
    params.pool[params.pool_pos] = sec;
    params.pool_pos++;

    if (params.pool_pos == params.pool_size)
    {
      train(params);
      params.pool_pos = 0;
    }
  }
}